

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

CServerEntry * __thiscall
CServerBrowser::Find(CServerBrowser *this,int ServerlistType,NETADDR *Addr)

{
  int iVar1;
  NETADDR *b;
  NETADDR *in_RDX;
  int in_ESI;
  long in_RDI;
  CServerEntry *pEntry;
  int in_stack_ffffffffffffffcc;
  CServerEntry *a;
  
  b = (NETADDR *)(in_RDI + 0xbdf8 + (long)in_ESI * 0x820);
  iVar1 = AddrHash(in_RDX);
  a = *(CServerEntry **)(b[1].ip + (long)iVar1 * 8 + -4);
  while( true ) {
    if (a == (CServerEntry *)0x0) {
      return (CServerEntry *)0x0;
    }
    iVar1 = net_addr_comp(&a->m_Addr,b,in_stack_ffffffffffffffcc);
    if (iVar1 == 0) break;
    a = a->m_pNextIp;
  }
  return a;
}

Assistant:

CServerEntry *CServerBrowser::Find(int ServerlistType, const NETADDR &Addr)
{
	for(CServerEntry *pEntry = m_aServerlist[ServerlistType].m_aServerlistIp[AddrHash(&Addr)]; pEntry; pEntry = pEntry->m_pNextIp)
	{
		if(net_addr_comp(&pEntry->m_Addr, &Addr, true) == 0)
			return pEntry;
	}
	return (CServerEntry*)0;
}